

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue1f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[1]> state;
  StateQueryMemoryWriteGuard<float[1]> local_19c;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_19c.m_preguard[0] = -8.0297587e+18;
  local_19c.m_value[0] = -8.0297587e+18;
  local_19c.m_postguard[0] = -8.0297587e+18;
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,local_19c.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[1]>::verifyValidity
                    (&local_19c,testCtx);
  if (bVar1) {
    if ((local_19c.m_value[0] != x) || (NAN(local_19c.m_value[0]) || NAN(x))) {
      local_190._0_8_ = testCtx->m_log;
      this = (ostringstream *)(local_190 + 8);
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"// ERROR: expected [",0x14);
      std::ostream::_M_insert<double>((double)x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]; got [",8);
      std::ostream::_M_insert<double>((double)local_19c.m_value[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_118);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
      }
    }
  }
  return;
}

Assistant:

void verifyUniformValue1f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[1]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x
		<< "]; got ["
		<< state[0]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}